

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_bool32 ma_dr_flac__seek_to_pcm_frame__binary_search(ma_dr_flac *pFlac,ma_uint64 pcmFrameIndex)

{
  ushort uVar1;
  ma_bool32 mVar2;
  ma_uint64 mVar3;
  ulong uVar4;
  ma_bool32 mVar5;
  float fVar6;
  
  uVar1 = pFlac->maxBlockSizeInPCMFrames;
  mVar2 = ma_dr_flac__seek_to_byte(&pFlac->bs,pFlac->firstFLACFramePosInBytes);
  mVar5 = 0;
  memset(&pFlac->currentFLACFrame,0,0xa8);
  if (mVar2 != 0) {
    uVar4 = 0x1000;
    if (uVar1 != 0) {
      uVar4 = (ulong)((uint)uVar1 + (uint)uVar1);
    }
    if (uVar4 <= pcmFrameIndex) {
      fVar6 = (float)(long)((ulong)pFlac->bitsPerSample *
                           (ulong)pFlac->channels * pFlac->totalPCMFrameCount) * 0.125;
      uVar4 = (ulong)fVar6;
      mVar2 = ma_dr_flac__seek_to_pcm_frame__binary_search_internal
                        (pFlac,pcmFrameIndex,pFlac->firstFLACFramePosInBytes,
                         ((long)(fVar6 - 9.223372e+18) & (long)uVar4 >> 0x3f | uVar4) +
                         pFlac->firstFLACFramePosInBytes);
      return mVar2;
    }
    mVar3 = ma_dr_flac__seek_forward_by_pcm_frames(pFlac,pcmFrameIndex);
    mVar5 = (ma_bool32)(mVar3 == pcmFrameIndex);
  }
  return mVar5;
}

Assistant:

static ma_bool32 ma_dr_flac__seek_to_pcm_frame__binary_search(ma_dr_flac* pFlac, ma_uint64 pcmFrameIndex)
{
    ma_uint64 byteRangeLo;
    ma_uint64 byteRangeHi;
    ma_uint32 seekForwardThreshold = (pFlac->maxBlockSizeInPCMFrames != 0) ? pFlac->maxBlockSizeInPCMFrames*2 : 4096;
    if (ma_dr_flac__seek_to_first_frame(pFlac) == MA_FALSE) {
        return MA_FALSE;
    }
    if (pcmFrameIndex < seekForwardThreshold) {
        return ma_dr_flac__seek_forward_by_pcm_frames(pFlac, pcmFrameIndex) == pcmFrameIndex;
    }
    byteRangeLo = pFlac->firstFLACFramePosInBytes;
    byteRangeHi = pFlac->firstFLACFramePosInBytes + (ma_uint64)((ma_int64)(pFlac->totalPCMFrameCount * pFlac->channels * pFlac->bitsPerSample)/8.0f);
    return ma_dr_flac__seek_to_pcm_frame__binary_search_internal(pFlac, pcmFrameIndex, byteRangeLo, byteRangeHi);
}